

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O2

void LinkedList_RemoveEntry(LinkedList **start,void *toRemove,FAudioMutex lock,FAudioFreeFunc pFree)

{
  LinkedList *pLVar1;
  LinkedList **ppLVar2;
  LinkedList *pLVar3;
  
  pLVar1 = *start;
  FAudio_PlatformLockMutex(lock);
  pLVar3 = pLVar1;
  do {
    if (pLVar3 == (LinkedList *)0x0) {
LAB_00116a18:
      FAudio_PlatformUnlockMutex(lock);
      return;
    }
    if (pLVar3->entry == toRemove) {
      ppLVar2 = &pLVar1->next;
      if (pLVar3 == pLVar1) {
        ppLVar2 = start;
      }
      *ppLVar2 = pLVar3->next;
      (*pFree)(pLVar3);
      goto LAB_00116a18;
    }
    pLVar1 = pLVar3;
    pLVar3 = pLVar3->next;
  } while( true );
}

Assistant:

void LinkedList_RemoveEntry(
	LinkedList **start,
	void* toRemove,
	FAudioMutex lock,
	FAudioFreeFunc pFree
) {
	LinkedList *latest, *prev;
	latest = *start;
	prev = latest;
	FAudio_PlatformLockMutex(lock);
	while (latest != NULL)
	{
		if (latest->entry == toRemove)
		{
			if (latest == prev) /* First in list */
			{
				*start = latest->next;
			}
			else
			{
				prev->next = latest->next;
			}
			pFree(latest);
			FAudio_PlatformUnlockMutex(lock);
			return;
		}
		prev = latest;
		latest = latest->next;
	}
	FAudio_PlatformUnlockMutex(lock);
	FAudio_assert(0 && "LinkedList element not found!");
}